

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor_injection.cpp
# Opt level: O0

int main(void)

{
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *this;
  i *piVar1;
  int *object;
  int local_1c;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_constructor_injection_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>
  local_15;
  scope<int,_int,_int> local_14;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_constructor_injection_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>_>
  local_10;
  i injector;
  
  this = boost::ext::di::v1_3_0::core::
         dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
         ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                       *)&boost::ext::di::v1_3_0::bind<int>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::
  named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_constructor_injection_cpp:14:13),_0>
            (this,(anon_class_1_0_00000001 *)&name);
  local_1c = 0x2a;
  object = &local_1c;
  local_14.object_ =
       (int)boost::ext::di::v1_3_0::core::
            dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/constructor_injection.cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>
            ::to<int,_0,_0>(&local_15,object);
  piVar1 = boost::ext::di::v1_3_0::
           make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_constructor_injection_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
                     ((i *)(ulong)(uint)local_14.object_,(scope<int,_int,_int>)(int)object);
  local_10.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_constructor_injection_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_constructor_injection_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<int,_int,_int>.object_ = SUB84(piVar1,0);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/constructor_injection.cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<ctor_inject,_0>(&local_10);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/constructor_injection.cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<ctor_inject_traits,_0>(&local_10);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/constructor_injection.cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<ctor_di_traits,_0>(&local_10);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/constructor_injection.cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<ctor_inject_traits_no_limits,_0>(&local_10);
  return 0;
}

Assistant:

int main() {
  /*<<make injector>>*/
  // clang-format off
  auto injector = di::make_injector(
    di::bind<int>().named(name).to(42)
  );
  // clang-format on

  /*<<create dependencies>>*/
  injector.create<ctor_inject>();
  injector.create<ctor_inject_traits>();
  injector.create<ctor_di_traits>();

  injector.create<ctor_inject_traits_no_limits>();
}